

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.tab.cpp
# Opt level: O2

void FlatZinc::solve(istream *is,ostream *err)

{
  FlatZincSpace *this;
  Array *pAVar1;
  string s;
  ParserState pp;
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&s,*(undefined8 *)(is + *(long *)(*(long *)is + -0x18) + 0xe8),
             0xffffffffffffffff,0,0xffffffff);
  pp.intvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pp.intvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header;
  pp.buf = s._M_dataplus._M_p;
  pp.pos = 0;
  pp.length = (uint)s._M_string_length;
  pp.intvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pp.intvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pp.fg = (FlatZincSpace *)0x0;
  pp._output.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pp._output.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pp._output.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pp.intvarTable.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pp.boolvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pp.boolvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header;
  pp.boolvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pp.boolvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pp.boolvarTable.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pp.floatvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pp.floatvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header;
  pp.floatvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pp.floatvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pp.floatvarTable.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pp.setvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pp.setvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header;
  pp.setvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pp.setvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pp.setvarTable.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pp.intvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pp.intvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header;
  pp.intvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pp.intvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pp.intvararrays.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pp.boolvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pp.boolvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header;
  pp.boolvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pp.boolvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pp.boolvararrays.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pp.floatvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pp.floatvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header;
  pp.floatvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pp.floatvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pp.floatvararrays.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pp.setvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pp.setvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header;
  pp.setvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pp.setvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pp.setvararrays.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pp.intvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pp.intvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header;
  pp.intvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pp.intvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pp.intvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pp.boolvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pp.boolvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header;
  pp.boolvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pp.boolvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pp.boolvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pp.intvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pp.intvals.m._M_t._M_impl.super__Rb_tree_header._M_header;
  pp.intvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pp.intvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pp.intvals.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pp.boolvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pp.boolvals.m._M_t._M_impl.super__Rb_tree_header._M_header;
  pp.boolvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pp.boolvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pp.boolvals.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pp.setvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pp.setvals.m._M_t._M_impl.super__Rb_tree_header._M_header;
  pp.setvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pp.setvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pp.setvals.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pp.setvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pp.setvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header;
  pp.setvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pp.setvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pp.intvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pp.intvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pp.boolvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pp.boolvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pp.floatvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pp.floatvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pp.setvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pp.setvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pp.intvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pp.intvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pp.boolvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pp.boolvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pp.floatvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pp.floatvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pp.setvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pp.setvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pp.intvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pp.intvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pp.boolvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pp.boolvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pp.intvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pp.intvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pp.boolvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pp.boolvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pp.setvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pp.setvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pp.setvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pp.setvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  memset(&pp.setvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0x99);
  pp.err = err;
  yylex_init(&pp.yyscanner);
  yyset_extra(&pp,pp.yyscanner);
  yyparse(&pp);
  pAVar1 = ParserState::getOutput(&pp);
  this = FlatZinc::s;
  FlatZinc::s->output = pAVar1;
  FlatZincSpace::setOutput(this);
  if (pp.yyscanner != (void *)0x0) {
    yylex_destroy(pp.yyscanner);
  }
  if (pp.hadError != true) {
    ParserState::~ParserState(&pp);
    std::__cxx11::string::~string((string *)&s);
    return;
  }
  abort();
}

Assistant:

void solve(std::istream& is, std::ostream& err) {
        std::string s = std::string(std::istreambuf_iterator<char>(is),
                               std::istreambuf_iterator<char>());

        ParserState pp(s, err);
        yylex_init(&pp.yyscanner);
        yyset_extra(&pp, pp.yyscanner);
        // yydebug = 1;
        yyparse(&pp);
        FlatZinc::s->output = pp.getOutput();
        FlatZinc::s->setOutput();

        if (pp.yyscanner)
            yylex_destroy(pp.yyscanner);
        if (pp.hadError) abort();
    }